

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa_array.c
# Opt level: O0

void aspa_array_free(aspa_array *array,_Bool free_provider_arrays)

{
  long lVar1;
  long in_FS_OFFSET;
  ulong local_28;
  size_t i;
  _Bool free_provider_arrays_local;
  aspa_array *array_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (array != (aspa_array *)0x0) {
    if (array->data != (aspa_record *)0x0) {
      if (free_provider_arrays) {
        for (local_28 = 0; local_28 < array->size; local_28 = local_28 + 1) {
          if (array->data[local_28].provider_asns != (uint32_t *)0x0) {
            lrtr_free(array->data[local_28].provider_asns);
            array->data[local_28].provider_asns = (uint32_t *)0x0;
          }
        }
      }
      lrtr_free(array->data);
    }
    lrtr_free(array);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void aspa_array_free(struct aspa_array *array, bool free_provider_arrays)
{
	if (!array)
		return;

	if (array->data) {
		if (free_provider_arrays) {
			for (size_t i = 0; i < array->size; i++) {
				if (array->data[i].provider_asns) {
					lrtr_free(array->data[i].provider_asns);
					array->data[i].provider_asns = NULL;
				}
			}
		}

		lrtr_free(array->data);
	}

	lrtr_free(array);
}